

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncRound(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
            vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  const_reference pvVar1;
  longlong lVar2;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  ExpressionValue *result;
  
  ExpressionValue::ExpressionValue(__return_storage_ptr__);
  pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[](parameters,0);
  if (pvVar1->type == Integer) {
    pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       (parameters,0);
    __return_storage_ptr__->field_1 = pvVar1->field_1;
  }
  else {
    if (pvVar1->type != Float) {
      return __return_storage_ptr__;
    }
    pvVar1 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       (parameters,0);
    lVar2 = llround((pvVar1->field_1).floatValue);
    (__return_storage_ptr__->field_1).intValue = lVar2;
  }
  __return_storage_ptr__->type = Integer;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRound(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Integer:
		result.intValue = parameters[0].intValue;
		break;
	case ExpressionValueType::Float:
		result.intValue = llround(parameters[0].floatValue);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::Integer;
	return result;
}